

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

void apx_vm_decoder_create(apx_vm_decoder_t *self)

{
  if (self != (apx_vm_decoder_t *)0x0) {
    (self->pack_unpack_info).type_code = '\0';
    (self->pack_unpack_info).array_length = 0;
    (self->pack_unpack_info).is_dynamic_array = false;
    self->program_begin = (uint8_t *)0x0;
    self->program_next = (uint8_t *)0x0;
    self->program_end = (uint8_t *)0x0;
    self->program_mark = (uint8_t *)0x0;
    self->operation_type = '\0';
    (self->range_check_uint32_info).lower_limit = 0;
    (self->range_check_uint32_info).upper_limit = 0;
    (self->range_check_uint64_info).lower_limit = 0;
    (self->range_check_uint64_info).upper_limit = 0;
    (self->range_check_int32_info).lower_limit = 0;
    (self->range_check_int32_info).upper_limit = 0;
    (self->range_check_int64_info).lower_limit = 0;
    (self->range_check_int64_info).upper_limit = 0;
    adt_str_create(&self->field_name);
    self->is_last_field = false;
  }
  return;
}

Assistant:

void apx_vm_decoder_create(apx_vm_decoder_t* self)
{
   if (self != NULL)
   {
      self->program_begin = NULL;
      self->program_next = NULL;
      self->program_end = NULL;
      self->program_mark = NULL;
      self->operation_type = APX_OPERATION_TYPE_PROGRAM_END;
      self->pack_unpack_info.type_code = APX_TYPE_CODE_NONE;
      self->pack_unpack_info.array_length = 0u;
      self->pack_unpack_info.is_dynamic_array = false;
      self->range_check_uint32_info.lower_limit = 0u;
      self->range_check_uint32_info.upper_limit = 0u;
      self->range_check_uint64_info.lower_limit = 0u;
      self->range_check_uint64_info.upper_limit = 0u;
      self->range_check_int32_info.lower_limit = 0;
      self->range_check_int32_info.upper_limit = 0;
      self->range_check_int64_info.lower_limit = 0;
      self->range_check_int64_info.upper_limit = 0;
      adt_str_create(&self->field_name);
      self->is_last_field = false;
   }
}